

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Annotation.h
# Opt level: O3

void __thiscall
OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::AnnotationMixin
          (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this)

{
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._forward.x = 0.0;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._forward.y = 0.0;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._side.x = -1.0;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._side.y = 0.0;
  *(undefined8 *)&(this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._side.z = 0;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._up.y = 1.0;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._up.z = 0.0;
  *(undefined8 *)&(this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._forward.z = 0x3f800000;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._position.y = 0.0;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>)._position.z = 0.0;
  (this->super_LocalSpaceMixin<OpenSteer::AbstractVehicle>).super_AbstractVehicle.
  super_AbstractLocalSpace._vptr_AbstractLocalSpace = (_func_int **)&PTR__AnnotationMixin_00177ad8;
  (this->curPosition).x = 0.0;
  (this->curPosition).y = 0.0;
  (this->curPosition).z = 0.0;
  this->trailVertices = (Vec3 *)0x0;
  this->trailFlags = (char *)0x0;
  setTrailParameters(this,5.0,100);
  return;
}

Assistant:

OpenSteer::AnnotationMixin<Super>::AnnotationMixin (void)
{
    trailVertices = NULL;
    trailFlags = NULL;

    // xxx I wonder if it makes more sense to NOT do this here, see if the
    // xxx vehicle class calls it to set custom parameters, and if not, set
    // xxx these default parameters on first call to a "trail" function.  The
    // xxx issue is whether it is a problem to allocate default-sized arrays
    // xxx then to free them and allocate new ones
    setTrailParameters (5, 100);  // 5 seconds with 100 points along the trail
}